

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.cpp
# Opt level: O0

Table * wasm::ModuleUtils::copyTable(Table *table,Module *out)

{
  bool bVar1;
  pointer pTVar2;
  Table *pTVar3;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> local_20;
  __single_object ret;
  Module *out_local;
  Table *table_local;
  
  ret._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
       (__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)out;
  std::make_unique<wasm::Table>();
  pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_20);
  wasm::Name::operator=((Name *)pTVar2,(Name *)table);
  bVar1 = (table->super_Importable).super_Named.hasExplicitName;
  pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_20);
  (pTVar2->super_Importable).super_Named.hasExplicitName = (bool)(bVar1 & 1);
  pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_20);
  (pTVar2->type).id = (table->type).id;
  pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_20);
  wasm::Name::operator=(&(pTVar2->super_Importable).module,&(table->super_Importable).module);
  pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_20);
  wasm::Name::operator=(&(pTVar2->super_Importable).base,&(table->super_Importable).base);
  pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_20);
  (pTVar2->initial).addr = (table->initial).addr;
  pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_20);
  (pTVar2->max).addr = (table->max).addr;
  pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_20);
  (pTVar2->addressType).id = (table->addressType).id;
  pTVar3 = Module::addTable((Module *)
                            ret._M_t.
                            super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                            .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl,&local_20);
  std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&local_20);
  return pTVar3;
}

Assistant:

Table* copyTable(const Table* table, Module& out) {
  auto ret = std::make_unique<Table>();
  ret->name = table->name;
  ret->hasExplicitName = table->hasExplicitName;
  ret->type = table->type;
  ret->module = table->module;
  ret->base = table->base;

  ret->initial = table->initial;
  ret->max = table->max;
  ret->addressType = table->addressType;

  return out.addTable(std::move(ret));
}